

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O0

void __thiscall xercesc_4_0::WFElemStack::expandMap(WFElemStack *this)

{
  XMLSize_t XVar1;
  int iVar2;
  undefined4 extraout_var;
  double dVar3;
  undefined1 auVar4 [16];
  ulong local_30;
  PrefMapElem *newMap;
  XMLSize_t newCapacity;
  WFElemStack *this_local;
  
  if (this->fMapCapacity == 0) {
    local_30 = 0x10;
  }
  else {
    XVar1 = this->fMapCapacity;
    auVar4._8_4_ = (int)(XVar1 >> 0x20);
    auVar4._0_8_ = XVar1;
    auVar4._12_4_ = 0x45300000;
    dVar3 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)XVar1) - 4503599627370496.0)) * 1.25;
    local_30 = (ulong)dVar3;
    local_30 = local_30 | (long)(dVar3 - 9.223372036854776e+18) & (long)local_30 >> 0x3f;
  }
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,local_30 << 3);
  if (this->fMapCapacity != 0) {
    memcpy((PrefMapElem *)CONCAT44(extraout_var,iVar2),this->fMap,this->fMapCapacity << 3);
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fMap);
  }
  this->fMap = (PrefMapElem *)CONCAT44(extraout_var,iVar2);
  this->fMapCapacity = local_30;
  return;
}

Assistant:

void WFElemStack::expandMap()
{
    //
    //  Expand the capacity by 25%, or initialize it to 16 if its currently
    //  empty. Then allocate a new temp buffer.
    //
    const XMLSize_t newCapacity = fMapCapacity ?
                                  (XMLSize_t)(fMapCapacity * 1.25) : 16;
    PrefMapElem* newMap = (PrefMapElem*) fMemoryManager->allocate
    (
        newCapacity * sizeof(PrefMapElem)
    );//new PrefMapElem[newCapacity];

    //
    //  Copy over the old stuff. We DON'T have to zero out the new stuff
    //  since this is a by value map and the current map index controls what
    //  is relevant.
    //
    if (fMapCapacity) {

        memcpy(newMap, fMap, fMapCapacity * sizeof(PrefMapElem));
        fMemoryManager->deallocate(fMap);//delete [] fMap;
    }

    fMap = newMap;
    fMapCapacity = newCapacity;
}